

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

void duckdb::DecimalRoundPositivePrecisionFunction<long,duckdb::NumericHelper>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  long lVar1;
  ulong count;
  long *plVar2;
  long *plVar3;
  unsigned_long *puVar4;
  data_ptr_t pdVar5;
  ulong uVar6;
  data_ptr_t pdVar7;
  byte bVar8;
  BoundFunctionExpression *pBVar9;
  pointer pFVar10;
  const_reference this;
  pointer pEVar11;
  long lVar12;
  reference vector;
  long lVar13;
  ulong uVar14;
  idx_t iVar15;
  idx_t i_2;
  ulong uVar16;
  ulong uVar17;
  idx_t entry_idx;
  ulong uVar18;
  ulong uVar19;
  idx_t i_1;
  idx_t row_idx;
  UnifiedVectorFormat local_78;
  
  pBVar9 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  pFVar10 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar9->bind_info);
  this = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
         ::get<true>(&pBVar9->children,0);
  pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(this);
  bVar8 = DecimalType::GetScale(&pEVar11->return_type);
  lVar1 = *(long *)(NumericHelper::POWERS_OF_TEN +
                   ((ulong)bVar8 - (long)*(int *)&pFVar10[1]._vptr_FunctionData) * 8);
  lVar12 = lVar1 / 2;
  vector = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
  count = input->count;
  if (vector->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar7 = result->data;
    pdVar5 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      for (uVar16 = 0; count != uVar16; uVar16 = uVar16 + 1) {
        lVar13 = lVar12;
        if (*(long *)(pdVar5 + uVar16 * 8) < 0) {
          lVar13 = -lVar12;
        }
        *(long *)(pdVar7 + uVar16 * 8) = (lVar13 + *(long *)(pdVar5 + uVar16 * 8)) / lVar1;
      }
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                 &(vector->validity).super_TemplatedValidityMask<unsigned_long>);
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar16 = 0;
      for (uVar18 = 0; uVar18 != count + 0x3f >> 6; uVar18 = uVar18 + 1) {
        if (puVar4 == (unsigned_long *)0x0) {
          uVar19 = uVar16 + 0x40;
          if (count <= uVar16 + 0x40) {
            uVar19 = count;
          }
LAB_01d1ffd3:
          for (; uVar14 = uVar16, uVar16 < uVar19; uVar16 = uVar16 + 1) {
            lVar13 = lVar12;
            if (*(long *)(pdVar5 + uVar16 * 8) < 0) {
              lVar13 = -lVar12;
            }
            *(long *)(pdVar7 + uVar16 * 8) = (lVar13 + *(long *)(pdVar5 + uVar16 * 8)) / lVar1;
          }
        }
        else {
          uVar6 = puVar4[uVar18];
          uVar19 = uVar16 + 0x40;
          if (count <= uVar16 + 0x40) {
            uVar19 = count;
          }
          if (uVar6 == 0xffffffffffffffff) goto LAB_01d1ffd3;
          uVar14 = uVar19;
          if (uVar6 != 0) {
            for (uVar17 = 0; uVar14 = uVar16 + uVar17, uVar16 + uVar17 < uVar19; uVar17 = uVar17 + 1
                ) {
              if ((uVar6 >> (uVar17 & 0x3f) & 1) != 0) {
                lVar13 = lVar12;
                if (*(long *)(pdVar5 + uVar17 * 8 + uVar16 * 8) < 0) {
                  lVar13 = -lVar12;
                }
                *(long *)(pdVar7 + uVar17 * 8 + uVar16 * 8) =
                     (lVar13 + *(long *)(pdVar5 + uVar17 * 8 + uVar16 * 8)) / lVar1;
              }
            }
          }
        }
        uVar16 = uVar14;
      }
    }
  }
  else if (vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    plVar2 = (long *)result->data;
    plVar3 = (long *)vector->data;
    puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    lVar13 = -lVar12;
    if (-1 < *plVar3) {
      lVar13 = lVar12;
    }
    *plVar2 = (lVar13 + *plVar3) / lVar1;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar7 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      for (uVar16 = 0; count != uVar16; uVar16 = uVar16 + 1) {
        uVar18 = uVar16;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar18 = (ulong)(local_78.sel)->sel_vector[uVar16];
        }
        lVar13 = lVar12;
        if (*(long *)(local_78.data + uVar18 * 8) < 0) {
          lVar13 = -lVar12;
        }
        *(long *)(pdVar7 + uVar16 * 8) = (lVar13 + *(long *)(local_78.data + uVar18 * 8)) / lVar1;
      }
    }
    else {
      for (row_idx = 0; count != row_idx; row_idx = row_idx + 1) {
        iVar15 = row_idx;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          iVar15 = (idx_t)(local_78.sel)->sel_vector[row_idx];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar15 >> 6]
             >> (iVar15 & 0x3f) & 1) == 0) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
        }
        else {
          lVar13 = lVar12;
          if (*(long *)(local_78.data + iVar15 * 8) < 0) {
            lVar13 = -lVar12;
          }
          *(long *)(pdVar7 + row_idx * 8) = (lVar13 + *(long *)(local_78.data + iVar15 * 8)) / lVar1
          ;
        }
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  }
  return;
}

Assistant:

static void DecimalRoundPositivePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	T power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[source_scale - info.target_scale]);
	T addition = power_of_ten / 2;
	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / power_of_ten);
	});
}